

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testchar.c
# Opt level: O0

void testCharRangeByte1(xmlParserCtxtPtr ctxt,char *data)

{
  int iVar1;
  int local_20;
  int c;
  int len;
  int i;
  char *data_local;
  xmlParserCtxtPtr ctxt_local;
  
  data[1] = '\0';
  data[2] = '\0';
  data[3] = '\0';
  _len = data;
  data_local = (char *)ctxt;
  for (c = 0; c < 0x100; c = c + 1) {
    *_len = (char)c;
    data_local[0x198] = '\x01';
    data_local[0x199] = '\0';
    data_local[0x19a] = '\0';
    data_local[0x19b] = '\0';
    lastError = 0;
    iVar1 = xmlCurrentChar(data_local,&local_20);
    if ((c == 0) || (0x7f < c)) {
      if (lastError != 9) {
        fprintf(_stderr,"Failed to detect invalid char for Byte 0x%02X\n",(ulong)(uint)c);
      }
    }
    else if (c == 0xd) {
      if ((iVar1 != 10) || (local_20 != 1)) {
        fprintf(_stderr,"Failed to convert char for Byte 0x%02X\n",0xd);
      }
    }
    else if ((iVar1 != c) || (local_20 != 1)) {
      fprintf(_stderr,"Failed to parse char for Byte 0x%02X\n",(ulong)(uint)c);
    }
  }
  return;
}

Assistant:

static void testCharRangeByte1(xmlParserCtxtPtr ctxt, char *data) {
    int i = 0;
    int len, c;

    data[1] = 0;
    data[2] = 0;
    data[3] = 0;
    for (i = 0;i <= 0xFF;i++) {
        data[0] = i;
	ctxt->charset = XML_CHAR_ENCODING_UTF8;

	lastError = 0;
        c = xmlCurrentChar(ctxt, &len);
	if ((i == 0) || (i >= 0x80)) {
	    /* we must see an error there */
	    if (lastError != XML_ERR_INVALID_CHAR)
	        fprintf(stderr,
		    "Failed to detect invalid char for Byte 0x%02X\n", i);
	} else if (i == 0xD) {
	    if ((c != 0xA) || (len != 1))
		fprintf(stderr, "Failed to convert char for Byte 0x%02X\n", i);
	} else if ((c != i) || (len != 1)) {
	    fprintf(stderr, "Failed to parse char for Byte 0x%02X\n", i);
	}
    }
}